

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

void __thiscall Cleaner::LoadDyndeps(Cleaner *this)

{
  State *pSVar1;
  pointer ppEVar2;
  string err;
  string local_48;
  
  pSVar1 = this->state_;
  for (ppEVar2 = (pSVar1->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar2 !=
      (pSVar1->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    if ((*ppEVar2)->dyndep_ != (Node *)0x0) {
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      DyndepLoader::LoadDyndeps(&this->dyndep_loader_,(*ppEVar2)->dyndep_,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      pSVar1 = this->state_;
    }
  }
  return;
}

Assistant:

void Cleaner::LoadDyndeps() {
  // Load dyndep files that exist, before they are cleaned.
  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    if (Node* dyndep = (*e)->dyndep_) {
      // Capture and ignore errors loading the dyndep file.
      // We clean as much of the graph as we know.
      std::string err;
      dyndep_loader_.LoadDyndeps(dyndep, &err);
    }
  }
}